

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool tinyexr::miniz::mz_zip_writer_write_zeros
                  (mz_zip_archive *pZip,mz_uint64 cur_file_ofs,mz_uint32 n)

{
  ulong uVar1;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  mz_uint32 s;
  char buf [4096];
  ulong local_1048;
  size_t local_1040;
  undefined1 local_1028 [4108];
  uint local_1c;
  long local_18;
  long local_10;
  
  if (in_EDX < 0x1001) {
    local_1040 = (size_t)in_EDX;
  }
  else {
    local_1040 = 0x1000;
  }
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_1028,0,local_1040);
  while( true ) {
    if (local_1c == 0) {
      return 1;
    }
    if (local_1c < 0x1001) {
      local_1048 = (ulong)local_1c;
    }
    else {
      local_1048 = 0x1000;
    }
    uVar1 = (**(code **)(local_10 + 0x48))
                      (*(undefined8 *)(local_10 + 0x50),local_18,local_1028,local_1048);
    if (uVar1 != local_1048) break;
    local_18 = local_1048 + local_18;
    local_1c = local_1c - (int)local_1048;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip,
                                         mz_uint64 cur_file_ofs, mz_uint32 n) {
  char buf[4096];
  memset(buf, 0, MZ_MIN(sizeof(buf), n));
  while (n) {
    mz_uint32 s = MZ_MIN(sizeof(buf), n);
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_file_ofs, buf, s) != s)
      return MZ_FALSE;
    cur_file_ofs += s;
    n -= s;
  }
  return MZ_TRUE;
}